

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O2

void __thiscall
burst::k_ary_search_set<int,_std::less<void>_>::k_ary_search_set
          (k_ary_search_set<int,_std::less<void>_> *this,initializer_list<int> values,size_t arity,
          value_compare *compare)

{
  iterator_range<const_int_*> local_20;
  
  local_20.super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
       values._M_array;
  (this->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->m_arity = arity;
  local_20.super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_End =
       local_20.
       super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
       super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
       super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
       + values._M_len;
  k_ary_search_set<int,std::less<void>>::initialize<boost::iterator_range<int_const*>>
            ((k_ary_search_set<int,std::less<void>> *)this,&local_20);
  return;
}

Assistant:

explicit k_ary_search_set
                (
                    std::initializer_list<value_type> values,
                    std::size_t arity = default_arity,
                    const value_compare & compare = value_compare()
                ):
            m_arity(arity),
            m_compare(compare)
        {
            initialize(boost::make_iterator_range(values));
        }